

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-memory.c
# Opt level: O0

int luaopen_memory(lua_State *L)

{
  undefined1 local_98 [8];
  luaL_Reg l [8];
  lua_State *L_local;
  
  luaL_checkversion_(L,503.0,0x88);
  memcpy(local_98,&PTR_anon_var_dwarf_a25d_00184490,0x80);
  luaL_checkversion_(L,503.0,0x88);
  lua_createtable(L,0,7);
  luaL_setfuncs(L,(luaL_Reg *)local_98,0);
  return 1;
}

Assistant:

int
luaopen_memory(lua_State *L) {
	luaL_checkversion(L);

	luaL_Reg l[] = {
		{ "total", ltotal },
		{ "block", lblock },
		{ "dumpinfo", ldumpinfo },
		{ "dump", ldump },
		{ "info", dump_mem_lua },
		{ "ssinfo", luaS_shrinfo },
		{ "ssexpand", lexpandshrtbl },
		{ NULL, NULL },
	};

	luaL_newlib(L,l);

	return 1;
}